

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::BrTableExpr::BrTableExpr(BrTableExpr *this,Location *loc)

{
  Location local_38;
  Location *local_18;
  Location *loc_local;
  BrTableExpr *this_local;
  
  local_18 = loc;
  loc_local = (Location *)this;
  ExprMixin<(wabt::ExprType)10>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)10>,loc);
  (this->super_ExprMixin<(wabt::ExprType)10>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BrTableExpr_01e53d70;
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::vector(&this->targets);
  Location::Location(&local_38);
  Var::Var(&this->default_target,0xffffffff,&local_38);
  return;
}

Assistant:

BrTableExpr(const Location& loc = Location())
      : ExprMixin<ExprType::BrTable>(loc) {}